

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderLocationAliasingTest::iterate(GeometryShaderLocationAliasingTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  char *description;
  qpTestResult testResult;
  bool has_shader_compilation_failed;
  char *gs_code_specialized_raw;
  char *fs_code_specialized_raw;
  char *vs_code_specialized_raw;
  string vs_code_specialized;
  string gs_code_specialized;
  char *gs_code_raw;
  string fs_code_specialized;
  undefined1 local_1a0 [384];
  long lVar6;
  
  has_shader_compilation_failed = true;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
               ,0x5e7);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  GVar4 = (**(code **)(lVar6 + 0x3c8))();
  this->m_po_id = GVar4;
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x5ef);
  GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar4;
  GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x5f6);
  gs_code_raw = 
  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\nlayout (location = 2) out vec4 test;\nlayout (location = 2) out vec4 test2;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n    test = vec4(1.0, 0.0, 0.0, 1.0);\n    test2 = vec4(1.0, 0.0, 0.0, 1.0);\n    EmitVertex();\n}\n"
  ;
  TestCaseBase::specializeShader_abi_cxx11_
            (&fs_code_specialized,&this->super_TestCaseBase,1,&dummy_fs_code);
  fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&gs_code_specialized,&this->super_TestCaseBase,1,&gs_code_raw);
  gs_code_specialized_raw = gs_code_specialized._M_dataplus._M_p;
  testResult = QP_TEST_RESULT_FAIL;
  TestCaseBase::specializeShader_abi_cxx11_
            (&vs_code_specialized,&this->super_TestCaseBase,1,&dummy_vs_code);
  vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
  bVar2 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_gs_id,1,
                     &gs_code_specialized_raw,this->m_vs_id,1,&vs_code_specialized_raw,this->m_fs_id
                     ,1,&fs_code_specialized_raw,&has_shader_compilation_failed);
  if (bVar2) {
    local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Program object was linked successfully, whereas a failure was expected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    if (has_shader_compilation_failed != false) goto LAB_00cf1316;
  }
  else {
    if (has_shader_compilation_failed != true) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00cf1370;
    }
LAB_00cf1316:
    local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Shader compilation failed unexpectedly.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  description = "Fail";
LAB_00cf1370:
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  std::__cxx11::string::~string((string *)&vs_code_specialized);
  std::__cxx11::string::~string((string *)&gs_code_specialized);
  std::__cxx11::string::~string((string *)&fs_code_specialized);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLocationAliasingTest::iterate()
{
	bool has_shader_compilation_failed = true;
	bool result						   = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create a program object */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Create shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	const char* gs_code_raw = "${VERSION}\n"
							  "${GEOMETRY_SHADER_REQUIRE}\n"
							  "\n"
							  "layout (points)                   in;\n"
							  "layout (points, max_vertices = 1) out;\n"
							  "\n"
							  "layout (location = 2) out vec4 test;\n"
							  "layout (location = 2) out vec4 test2;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    gl_Position = gl_in[0].gl_Position;\n"
							  "    test = vec4(1.0, 0.0, 0.0, 1.0);\n"
							  "    test2 = vec4(1.0, 0.0, 0.0, 1.0);\n"
							  "    EmitVertex();\n"
							  "}\n";

	std::string fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();
	std::string gs_code_specialized		= specializeShader(1, &gs_code_raw);
	const char* gs_code_specialized_raw = gs_code_specialized.c_str();
	std::string vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	if (TestCaseBase::buildProgram(m_po_id, m_gs_id, 1,					 /* n_sh1_body_parts */
								   &gs_code_specialized_raw, m_vs_id, 1, /* n_sh2_body_parts */
								   &vs_code_specialized_raw, m_fs_id, 1, /* n_sh3_body_parts */
								   &fs_code_specialized_raw, &has_shader_compilation_failed))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Program object was linked successfully, whereas a failure was expected."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (has_shader_compilation_failed)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Shader compilation failed unexpectedly."
						   << tcu::TestLog::EndMessage;

		result = false;
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}